

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_math_random(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  uint64_t uVar1;
  JSContext *in_RDI;
  JSValue JVar2;
  uint64_t v;
  JSFloat64Union u;
  
  uVar1 = xorshift64star(&in_RDI->random_state);
  JVar2 = __JS_NewFloat64(in_RDI,(double)(uVar1 >> 0xc | 0x3ff0000000000000) + -1.0);
  return JVar2;
}

Assistant:

static JSValue js_math_random(JSContext *ctx, JSValueConst this_val,
                              int argc, JSValueConst *argv)
{
    JSFloat64Union u;
    uint64_t v;

    v = xorshift64star(&ctx->random_state);
    /* 1.0 <= u.d < 2 */
    u.u64 = ((uint64_t)0x3ff << 52) | (v >> 12);
    return __JS_NewFloat64(ctx, u.d - 1.0);
}